

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::anon_unknown_26::AssertionPrinter::printExpressionWas(AssertionPrinter *this)

{
  ostream *stream;
  ColourGuard local_28;
  
  if ((this->result->m_info).capturedExpression.m_size != 0) {
    local_28.m_colourImpl = (ColourImpl *)CONCAT71(local_28.m_colourImpl._1_7_,0x3b);
    std::__ostream_insert<char,std::char_traits<char>>(this->stream,(char *)&local_28,1);
    stream = this->stream;
    local_28.m_colourImpl = this->colourImpl;
    local_28.m_code = FileName;
    local_28.m_engaged = false;
    ColourImpl::ColourGuard::engageImpl(&local_28,stream);
    std::__ostream_insert<char,std::char_traits<char>>(stream," expression was:",0x10);
    if (local_28.m_engaged == true) {
      (*(local_28.m_colourImpl)->_vptr_ColourImpl[2])(local_28.m_colourImpl,0);
    }
    printOriginalExpression(this);
  }
  return;
}

Assistant:

void printExpressionWas() {
        if (result.hasExpression()) {
            stream << ';';
            {
                stream << colourImpl->guardColour(compactDimColour) << " expression was:";
            }
            printOriginalExpression();
        }
    }